

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseOptions
          (Parser *this,LocationRecorder *parent_location,int optionsFieldNumber,
          Message *mutable_options)

{
  bool bVar1;
  allocator<char> local_5d;
  int local_5c;
  Message *local_58;
  LocationRecorder location;
  
  local_5c = optionsFieldNumber;
  local_58 = mutable_options;
  ConsumeEndOfDeclaration(this,"{",parent_location);
  while( true ) {
    bVar1 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
    if (bVar1) {
      return bVar1;
    }
    if ((this->input_->current_).type == TYPE_END) break;
    bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
    if (!bVar1) {
      LocationRecorder::LocationRecorder(&location,parent_location,local_5c);
      bVar1 = ParseOption(this,local_58,&location,OPTION_STATEMENT);
      if (!bVar1) {
        SkipStatement(this);
      }
      LocationRecorder::~LocationRecorder(&location);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&location,"Reached end of input in method options (missing \'}\').",&local_5d
            );
  AddError(this,(string *)&location);
  std::__cxx11::string::~string((string *)&location);
  return bVar1;
}

Assistant:

bool Parser::ParseOptions(const LocationRecorder& parent_location,
                          const int optionsFieldNumber,
                          Message* mutable_options) {
  // Options!
  ConsumeEndOfDeclaration("{", &parent_location);
  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in method options (missing '}').");
      return false;
    }

    if (TryConsumeEndOfDeclaration(";", NULL)) {
      // empty statement; ignore
    } else {
      LocationRecorder location(parent_location,
                                optionsFieldNumber);
      if (!ParseOption(mutable_options, location, OPTION_STATEMENT)) {
        // This statement failed to parse.  Skip it, but keep looping to
        // parse other statements.
        SkipStatement();
      }
    }
  }

  return true;
}